

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

void __thiscall
phyr::Film::mergeFilmTile
          (Film *this,unique_ptr<phyr::FilmTile,_std::default_delete<phyr::FilmTile>_> *tile)

{
  bool bVar1;
  pointer this_00;
  Bounds2iIterator BVar2;
  double xyz [3];
  Pixel *filmPixel;
  FilmTilePixel *tilePixel;
  Point2i pixel;
  Bounds2iIterator __end1;
  Bounds2iIterator __begin1;
  Bounds2i *__range1;
  lock_guard<std::mutex> lock;
  Bounds2i *in_stack_fffffffffffffee8;
  Point2i in_stack_fffffffffffffef0;
  Pixel *in_stack_fffffffffffffef8;
  FilmTilePixel *in_stack_ffffffffffffff00;
  double local_98;
  double local_90;
  double local_88;
  Pixel *local_78;
  FilmTilePixel *local_70;
  Point2i local_68;
  Bounds2iIterator local_60;
  Bounds2iIterator local_50 [2];
  Bounds2i local_30;
  Bounds2i *local_20;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffef0,
             (mutex_type *)in_stack_fffffffffffffee8);
  this_00 = std::unique_ptr<phyr::FilmTile,_std::default_delete<phyr::FilmTile>_>::operator->
                      ((unique_ptr<phyr::FilmTile,_std::default_delete<phyr::FilmTile>_> *)0x1833e4)
  ;
  local_30 = FilmTile::getPixelBounds(this_00);
  local_20 = &local_30;
  local_50[0] = phyr::begin((Bounds2i *)0x18342f);
  local_60 = phyr::end((Bounds2i *)in_stack_fffffffffffffef0);
  BVar2.bounds = in_stack_fffffffffffffee8;
  BVar2.pt = in_stack_fffffffffffffef0;
  while( true ) {
    bVar1 = Bounds2iIterator::operator!=
                      ((Bounds2iIterator *)in_stack_ffffffffffffff00,
                       (Bounds2iIterator *)in_stack_fffffffffffffef8);
    if (!bVar1) break;
    local_68 = Bounds2iIterator::operator*(local_50);
    std::unique_ptr<phyr::FilmTile,_std::default_delete<phyr::FilmTile>_>::operator->
              ((unique_ptr<phyr::FilmTile,_std::default_delete<phyr::FilmTile>_> *)0x1834db);
    in_stack_ffffffffffffff00 = FilmTile::getPixel((FilmTile *)BVar2.pt,&(BVar2.bounds)->pMin);
    local_70 = in_stack_ffffffffffffff00;
    in_stack_fffffffffffffef8 = getPixel((Film *)BVar2.pt,&(BVar2.bounds)->pMin);
    local_78 = in_stack_fffffffffffffef8;
    SampledSpectrum::toXYZConstants(&local_70->contributionSum,&local_98);
    local_78->xyz[0] = local_98 + local_78->xyz[0];
    local_78->xyz[1] = local_90 + local_78->xyz[1];
    local_78->xyz[2] = local_88 + local_78->xyz[2];
    local_78->filterWeightSum = local_70->filterWeightSum + local_78->filterWeightSum;
    BVar2 = Bounds2iIterator::operator++((Bounds2iIterator *)BVar2.bounds);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x18360d);
  return;
}

Assistant:

void Film::mergeFilmTile(std::unique_ptr<FilmTile> tile) {
    // Acquire lock
    std::lock_guard<std::mutex> lock(mutex);

    // Iterate through all pixels within pixel bounds
    for (Point2i pixel : tile->getPixelBounds()) {
        // Merge pixel into {Film::pixels}
        FilmTilePixel& tilePixel = tile->getPixel(pixel);
        Pixel& filmPixel = getPixel(pixel);

        // Get xyz spectrum data
        Real xyz[3];
        tilePixel.contributionSum.toXYZConstants(xyz);
        // Add spectrum data to {filmPixel}
        filmPixel.xyz[0] += xyz[0]; filmPixel.xyz[1] += xyz[1];
        filmPixel.xyz[2] += xyz[2];
        filmPixel.filterWeightSum += tilePixel.filterWeightSum;
    }
}